

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::DiskSourceTreeTest::AddFile
          (DiskSourceTreeTest *this,string *filename,char *contents)

{
  char *pcVar1;
  undefined8 extraout_RAX;
  string_view contents_00;
  Status local_28 [2];
  
  pcVar1 = (char *)strlen((char *)filename);
  contents_00._M_str = pcVar1;
  contents_00._M_len = (size_t)local_28;
  File::WriteStringToFile(contents_00,filename);
  if ((StatusRep *)local_28[0].rep_ != (StatusRep *)0x1) {
    absl::lts_20250127::status_internal::MakeCheckFailString
              (local_28,"File::SetContents(filename, contents, true) is OK");
  }
  if ((local_28[0].rep_ & 1) == 0) {
    absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_28[0].rep_);
  }
  if ((StatusRep *)local_28[0].rep_ != (StatusRep *)0x1) {
    compiler::_GLOBAL__N_1::DiskSourceTreeTest::AddFile();
    __clang_call_terminate(extraout_RAX);
  }
  return;
}

Assistant:

void AddFile(const std::string& filename, const char* contents) {
    ABSL_CHECK_OK(File::SetContents(filename, contents, true));
  }